

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

pair<unsigned_long,_bool> __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::string,int>,std::function<unsigned_long(std::__cxx11::string_const&)>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
::find_or_prepare_insert<std::__cxx11::string>
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::string,int>,std::function<unsigned_long(std::__cxx11::string_const&)>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,size_t hash)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  undefined8 extraout_RDX;
  undefined8 uVar8;
  ulong uVar9;
  long lVar10;
  size_t sVar11;
  __m128i match;
  undefined1 auVar12 [64];
  pair<unsigned_long,_bool> pVar13;
  EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar1 = *(ulong *)(this + 0x18);
  uVar9 = hash >> 7;
  lVar10 = 0;
  auVar2 = vpbroadcastb_avx512vl();
  auVar12 = ZEXT1664(auVar2);
  do {
    uVar9 = uVar9 & uVar1;
    uVar7 = vpcmpeqb_avx512vl(auVar12._0_16_,*(undefined1 (*) [16])(*(long *)this + uVar9));
    auVar2 = *(undefined1 (*) [16])(*(long *)this + uVar9);
    while (uVar6 = (uint)uVar7, uVar6 != 0) {
      uVar3 = 0;
      for (uVar4 = uVar6; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x80000000) {
        uVar3 = uVar3 + 1;
      }
      local_48 = auVar12._0_16_;
      sVar11 = uVar3 + uVar9 & uVar1;
      local_68.rhs = key;
      local_68.eq = (key_equal *)(this + 0x28);
      local_58 = auVar2;
      bVar5 = DecomposePair<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::string,int>,std::function<unsigned_long(std::__cxx11::string_const&)>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>::EqualElement<std::__cxx11::string>,std::pair<std::__cxx11::string_const,int>&>
                        (&local_68,
                         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                          *)(sVar11 * 0x28 + *(long *)(this + 8)));
      if (bVar5) {
        uVar8 = 0;
        goto LAB_00165cbc;
      }
      auVar12 = ZEXT1664(local_48);
      auVar2 = local_58;
      uVar7 = (ulong)(uVar6 - 1 & uVar6);
    }
    auVar2 = vpsignb_avx(auVar2,auVar2);
    if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar2 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar2 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar2 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar2 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar2 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar2 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar2 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar2 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar2 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar2 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar2 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar2 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar2 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar2[0xf] < '\0') {
      sVar11 = raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::prepare_insert((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                 *)this,hash);
      uVar8 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_00165cbc:
      pVar13._8_8_ = uVar8;
      pVar13.first = sVar11;
      return pVar13;
    }
    uVar9 = lVar10 + 0x10 + uVar9;
    lVar10 = lVar10 + 0x10;
  } while( true );
}

Assistant:

std::pair<size_t, bool> find_or_prepare_insert(const K& key, size_t hash) {
        auto seq = probe(hash);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (int i : g.Match(H2(hash))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                                          EqualElement<K>{key, eq_ref()},
                                          PolicyTraits::element(slots_ + seq.offset(i)))))
                    return {seq.offset(i), false};
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) break;
            seq.next();
        }
        return {prepare_insert(hash), true};
    }